

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte bVar1;
  char cVar2;
  char_t **ppcVar3;
  xml_document_struct *pxVar4;
  bool bVar5;
  xml_encoding xVar6;
  undefined4 extraout_var;
  value_type vVar7;
  char_t *pcVar8;
  value_type puVar9;
  value_type puVar10;
  size_t sVar11;
  xml_node_struct *pxVar12;
  xml_attribute_struct *pxVar13;
  xml_node_struct *pxVar14;
  char_t *pcVar15;
  xml_node_struct *pxVar16;
  xml_node_struct **ppxVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  ushort *puVar21;
  undefined2 *puVar22;
  char *pcVar23;
  long lVar24;
  byte *pbVar25;
  long lVar26;
  byte *pbVar27;
  ushort uVar28;
  uint uVar29;
  xml_node_struct *pxVar30;
  long lVar31;
  ulong uVar32;
  xml_parse_status xVar33;
  ushort *puVar34;
  ushort uVar35;
  long lVar36;
  long lVar37;
  size_t sVar38;
  xml_node_struct *pxVar39;
  xml_node_struct *pxVar40;
  undefined2 *puVar41;
  size_t sVar42;
  ulong uVar43;
  long lStack_e0;
  xml_node_struct *local_b0;
  xml_document_struct *local_a8;
  size_t length;
  char_t *buffer;
  xml_node_struct *local_90;
  undefined8 local_88;
  xml_node_struct *local_80;
  xml_node_struct *local_78;
  uint local_6c;
  gap local_68;
  xml_node_struct *local_58;
  xml_node_struct **local_50;
  code *local_48;
  code *local_40;
  xml_node_struct *local_38;
  
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    goto LAB_0011bddc;
  }
  xVar6 = get_buffer_encoding(encoding,contents,size);
  local_88 = CONCAT44(extraout_var,xVar6);
  buffer = (char_t *)0x0;
  length = 0;
  lVar24 = 1;
  local_a8 = doc;
  local_78 = root;
  if (xVar6 == encoding_utf8) {
LAB_0011bdbd:
    bVar5 = get_mutable_buffer(&buffer,&length,contents,size,is_mutable);
    if (bVar5) goto LAB_0011c2d7;
  }
  else if ((xVar6 & ~encoding_utf8) == encoding_utf16_le) {
    uVar43 = size >> 1;
    if (xVar6 == encoding_utf16_le) {
      lVar31 = 0;
      lVar26 = -1;
      puVar34 = (ushort *)contents;
      for (uVar32 = uVar43; uVar32 != 0; uVar32 = uVar32 + lVar37) {
        uVar35 = *puVar34;
        lVar37 = lVar26;
        if (uVar35 < 0xd800) {
          lVar36 = 3 - (ulong)(uVar35 < 0x800);
          if (uVar35 < 0x80) {
            lVar36 = lVar24;
          }
          lVar31 = lVar31 + lVar36;
LAB_0011be58:
          puVar21 = puVar34 + 1;
        }
        else {
          if ((~uVar35 & 0xe000) == 0) {
            lVar31 = lVar31 + 3;
            goto LAB_0011be58;
          }
          puVar21 = puVar34 + 1;
          if (((uVar32 != 1) && ((uVar35 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc00) == 0xdc00)) {
            lVar31 = lVar31 + 4;
            puVar21 = puVar34 + 2;
            lVar37 = -2;
          }
        }
        puVar34 = puVar21;
      }
      sVar38 = lVar31 + 1;
      puVar9 = (value_type)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(sVar38);
      if (puVar9 != (value_type)0x0) {
        lVar24 = -1;
        puVar10 = puVar9;
        puVar34 = (ushort *)contents;
        for (; uVar43 != 0; uVar43 = uVar43 + lStack_e0) {
          uVar35 = *puVar34;
          uVar29 = (uint)uVar35;
          lStack_e0 = lVar24;
          if ((uVar35 < 0xd800) || ((~uVar35 & 0xe000) == 0)) {
            puVar10 = utf8_writer::low(puVar10,uVar29);
            puVar21 = puVar34 + 1;
          }
          else {
            puVar21 = puVar34 + 1;
            if (((uVar43 != 1) && ((uVar29 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc00) == 0xdc00))
            {
              puVar10 = utf8_writer::high(puVar10,(uVar29 & 0x3ff) * 0x400 + 0x10000 +
                                                  (*puVar21 & 0x3ff));
              puVar21 = puVar34 + 2;
              lStack_e0 = -2;
            }
          }
          puVar34 = puVar21;
        }
        if (puVar10 != puVar9 + lVar31) {
          pcVar23 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
LAB_0011d3eb:
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x88e,pcVar23);
        }
LAB_0011c2ca:
        *puVar10 = '\0';
        length = sVar38;
        buffer = puVar9;
LAB_0011c2d7:
        pxVar16 = local_78;
        pcVar8 = buffer;
        pxVar4 = local_a8;
        xVar6 = (xml_encoding)local_88;
        if (own) {
          if (contents != (void *)0x0 && buffer != (char_t *)contents) {
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
LAB_0011c328:
          *out_buffer = pcVar8;
        }
        else if (buffer != (char_t *)contents) goto LAB_0011c328;
        pxVar4->buffer = pcVar8;
        if (length != 0) {
          if (pxVar16->first_child == (xml_node_struct *)0x0) {
            local_58 = (xml_node_struct *)0x0;
          }
          else {
            local_58 = pxVar16->first_child->prev_sibling_c;
          }
          bVar1 = pcVar8[length - 1];
          pcVar8[length - 1] = '\0';
          pxVar39 = (xml_node_struct *)pcVar8;
          if ((*pcVar8 == 0xef) && (pcVar8[1] == 0xbb)) {
            pxVar39 = (xml_node_struct *)(pcVar8 + (ulong)(pcVar8[2] == 0xbf) * 3);
          }
          local_50 = &pxVar16->first_child;
          local_38 = (xml_node_struct *)length;
          local_a8 = (xml_document_struct *)&pxVar4->super_xml_allocator;
          local_80 = (xml_node_struct *)(length - 1);
          local_40 = (code *)(&PTR_parse_simple_001b43e0)[options >> 4 & 0xf];
          local_6c = options & 0x22;
          local_48 = (code *)(&PTR_parse_001b4460)[(options >> 4 & 3) + (options >> 0xb & 1) * 4];
          bVar18 = bVar1 ^ 0x3e;
LAB_0011c458:
          do {
            bVar19 = (byte)pxVar39->header;
            while( true ) {
              pxVar12 = pxVar39;
              if (bVar19 == 0) goto LAB_0011d0bd;
              if (bVar19 == 0x3c) goto LAB_0011c4ec;
              lVar24 = 0;
              while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0) {
                bVar19 = *(byte *)((long)&pxVar12->header + lVar24 + 1);
                lVar24 = lVar24 + 1;
              }
              if ((bVar19 != 0x3c) && (bVar19 != 0)) break;
              if (lVar24 == 0) {
                __assert_fail("mark != s",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                              ,0xd63,
                              "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                             );
              }
              pxVar39 = (xml_node_struct *)((long)&pxVar12->header + lVar24);
              if (((options >> 0xb & 1) == 0 && (options & 0x408) != 0) &&
                 (((options >> 10 & 1) == 0 ||
                  (((bVar19 == 0x3c && (*(byte *)((long)&pxVar12->header + lVar24 + 1) == 0x2f)) &&
                   (pxVar16->first_child == (xml_node_struct *)0x0)))))) break;
            }
            if ((options >> 0xb & 1) != 0) {
              pxVar12 = (xml_node_struct *)((long)&pxVar12->header + lVar24);
            }
            if (((options >> 0xc & 1) != 0) || (pxVar16->parent != (xml_node_struct *)0x0)) {
              if ((((options >> 0xd & 1) == 0) ||
                  ((pxVar16->parent == (xml_node_struct *)0x0 ||
                   (pxVar16->first_child != (xml_node_struct *)0x0)))) ||
                 (pxVar16->value != (char_t *)0x0)) {
                pxVar16 = append_new_node(pxVar16,(xml_allocator *)local_a8,node_pcdata);
                if (pxVar16 != (xml_node_struct *)0x0) {
                  pxVar16->value = (char_t *)pxVar12;
                  pxVar16 = pxVar16->parent;
                  goto LAB_0011c534;
                }
                goto LAB_0011d135;
              }
              pxVar16->value = (char_t *)pxVar12;
LAB_0011c534:
              pxVar12 = (xml_node_struct *)(*local_48)(pxVar12);
              bVar19 = (byte)pxVar12->header;
              if (bVar19 != 0) goto LAB_0011c550;
LAB_0011d0bd:
              pxVar14 = (xml_node_struct *)0x0;
              if (pxVar16 != local_78) {
                pxVar14 = pxVar12;
              }
              xVar33 = status_end_element_mismatch;
              if (pxVar16 == local_78) {
                xVar33 = status_ok;
              }
              goto LAB_0011d236;
            }
            while( true ) {
              bVar19 = (byte)pxVar12->header;
              if (bVar19 == 0) goto LAB_0011d0bd;
              if (bVar19 == 0x3c) break;
              pxVar12 = (xml_node_struct *)((long)&pxVar12->header + 1);
            }
LAB_0011c4ec:
            bVar19 = *(byte *)((long)&pxVar12->header + 1);
            pxVar12 = (xml_node_struct *)((long)&pxVar12->header + 1);
LAB_0011c550:
            if (-1 < (char)(anonymous_namespace)::chartype_table[bVar19]) {
              if (bVar19 == 0x21) {
                bVar19 = *(byte *)((long)&pxVar12->header + 1);
                if (bVar19 == 0x5b) {
                  if (*(byte *)((long)&pxVar12->header + 2) == 0x43) {
                    if (*(byte *)((long)&pxVar12->header + 3) == 0x44) {
                      if (*(byte *)((long)&pxVar12->header + 4) == 0x41) {
                        if (*(byte *)((long)&pxVar12->header + 5) == 0x54) {
                          if (*(byte *)((long)&pxVar12->header + 6) == 0x41) {
                            if (*(byte *)((long)&pxVar12->header + 7) == 0x5b) {
                              pxVar14 = (xml_node_struct *)&pxVar12->name;
                              if ((options & 4) == 0) {
                                do {
                                  if (*(byte *)&pxVar14->header == 0x5d) {
                                    if (*(byte *)((long)&pxVar14->header + 1) == 0x5d) {
                                      bVar19 = *(byte *)((long)&pxVar14->header + 2);
                                      if ((bVar19 == 0x3e) || (bVar18 == 0 && bVar19 == 0))
                                      goto LAB_0011d02b;
                                    }
                                  }
                                  else if (*(byte *)&pxVar14->header == 0) goto LAB_0011d224;
                                  pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                                } while( true );
                              }
                              pxVar39 = append_new_node(pxVar16,(xml_allocator *)local_a8,node_cdata
                                                       );
                              if (pxVar39 != (xml_node_struct *)0x0) {
                                pxVar39->value = (char_t *)pxVar14;
                                if ((options & 0x20) != 0) {
                                  local_68.end = (char_t *)0x0;
                                  local_68.size = 0;
LAB_0011cd71:
                                  do {
                                    while (bVar19 = *(byte *)&pxVar14->header,
                                          ((anonymous_namespace)::chartype_table[bVar19] & 0x10) ==
                                          0) {
                                      bVar19 = *(byte *)((long)&pxVar14->header + 1);
                                      if (((anonymous_namespace)::chartype_table[bVar19] & 0x10) !=
                                          0) {
                                        pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                                        break;
                                      }
                                      bVar19 = *(byte *)((long)&pxVar14->header + 2);
                                      if (((anonymous_namespace)::chartype_table[bVar19] & 0x10) !=
                                          0) {
                                        pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 2);
                                        break;
                                      }
                                      bVar19 = *(byte *)((long)&pxVar14->header + 3);
                                      if (((anonymous_namespace)::chartype_table[bVar19] & 0x10) !=
                                          0) {
                                        pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 3);
                                        break;
                                      }
                                      pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 4);
                                    }
                                    if (bVar19 == 0xd) {
                                      local_b0 = (xml_node_struct *)((long)&pxVar14->header + 1);
                                      *(byte *)&pxVar14->header = 10;
                                      ppcVar3 = (char_t **)&pxVar14->header;
                                      pxVar14 = local_b0;
                                      if (*(byte *)((long)ppcVar3 + 1) == 10) {
                                        gap::push(&local_68,(char_t **)&local_b0,1);
                                        pxVar14 = local_b0;
                                      }
                                      goto LAB_0011cd71;
                                    }
                                    local_b0 = pxVar14;
                                    if (bVar19 == 0x5d) {
                                      if ((*(byte *)((long)&pxVar14->header + 1) == 0x5d) &&
                                         ((bVar19 = *(byte *)((long)&pxVar14->header + 2),
                                          bVar19 == 0x3e || (bVar18 == 0 && bVar19 == 0))))
                                      goto LAB_0011d00a;
                                    }
                                    else if (bVar19 == 0) {
                                      xVar33 = status_bad_cdata;
                                      pxVar14 = (xml_node_struct *)pxVar39->value;
                                      goto LAB_0011d236;
                                    }
                                    pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                                  } while( true );
                                }
                                do {
                                  if (*(byte *)&pxVar14->header == 0x5d) {
                                    if (*(byte *)((long)&pxVar14->header + 1) == 0x5d) {
                                      bVar19 = *(byte *)((long)&pxVar14->header + 2);
                                      if ((bVar19 == 0x3e) || (bVar18 == 0 && bVar19 == 0))
                                      goto LAB_0011cffd;
                                    }
                                  }
                                  else if (*(byte *)&pxVar14->header == 0) goto LAB_0011d224;
                                  pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                                } while( true );
                              }
                              goto LAB_0011d210;
                            }
                            pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 7);
                          }
                          else {
                            pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 6);
                          }
                        }
                        else {
                          pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 5);
                        }
                      }
                      else {
                        pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 4);
                      }
                    }
                    else {
                      pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 3);
                    }
                  }
                  else {
                    pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 2);
                  }
LAB_0011d224:
                  xVar33 = status_bad_cdata;
                }
                else {
                  pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 1);
                  if (bVar19 == 0x44) {
                    if ((((*(byte *)((long)&pxVar12->header + 2) == 0x4f) &&
                         (*(byte *)((long)&pxVar12->header + 3) == 0x43)) &&
                        (*(byte *)((long)&pxVar12->header + 4) == 0x54)) &&
                       ((*(byte *)((long)&pxVar12->header + 5) == 0x59 &&
                        (*(byte *)((long)&pxVar12->header + 6) == 0x50)))) {
                      bVar19 = *(byte *)((long)&pxVar12->header + 7);
                      if ((bVar19 != 0x45) && (bVar1 != 0x45 || bVar19 != 0)) goto LAB_0011d158;
                      pxVar39 = (xml_node_struct *)((long)&pxVar12[-1].first_attribute + 7);
                      if (pxVar16->parent == (xml_node_struct *)0x0) {
                        bVar19 = (byte)pxVar39->header;
                        if ((bVar19 != 0x3c) && (bVar19 != 0)) {
                          __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                                        ,0xbb5,
                                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                                       );
                        }
                        bVar19 = 0x44;
                        lVar24 = 0;
                        pxVar39 = pxVar14;
LAB_0011ca0c:
                        if ((bVar19 == 0x22) || (bVar19 == 0x27)) {
                          pxVar14 = (xml_node_struct *)((long)&pxVar39->header + 1);
                          do {
                            pxVar39 = pxVar14;
                            bVar20 = (byte)pxVar39->header;
                            pxVar14 = (xml_node_struct *)((long)&pxVar39->header + 1);
                            if (bVar20 == 0) break;
                          } while (bVar20 != bVar19);
                          if (bVar20 == 0) goto LAB_0011d22e;
                        }
                        else {
                          if (bVar19 == 0x3c) {
                            bVar19 = *(byte *)((long)&pxVar39->header + 1);
                            if (bVar19 == 0x3f) {
                              pxVar39 = (xml_node_struct *)((long)&pxVar39->header + 2);
                              do {
                                bVar19 = (byte)pxVar39->header;
                                if (bVar19 == 0x3f) {
                                  if (*(byte *)((long)&pxVar39->header + 1) == 0x3e)
                                  goto LAB_0011cb09;
                                }
                                else if (bVar19 == 0) goto LAB_0011d22e;
                                pxVar39 = (xml_node_struct *)((long)&pxVar39->header + 1);
                              } while( true );
                            }
                            if (bVar19 == 0x21) {
                              bVar19 = *(byte *)((long)&pxVar39->header + 2);
                              if (bVar19 != 0x2d) {
                                if (bVar19 == 0x5b) {
                                  pxVar14 = (xml_node_struct *)((long)&pxVar39->header + 3);
                                  lVar26 = 0;
LAB_0011ca8e:
                                  pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 3);
                                  do {
                                    cVar2 = *(char *)((long)&pxVar14[-1].first_attribute + 5);
                                    if (cVar2 == '<') {
                                      if ((*(char *)((long)&pxVar14[-1].first_attribute + 6) == '!')
                                         && (*(char *)((long)&pxVar14[-1].first_attribute + 7) ==
                                             '[')) {
                                        lVar26 = lVar26 + 1;
                                        goto LAB_0011ca8e;
                                      }
                                    }
                                    else if (cVar2 == ']') {
                                      if ((*(char *)((long)&pxVar14[-1].first_attribute + 6) == ']')
                                         && (*(char *)((long)&pxVar14[-1].first_attribute + 7) ==
                                             '>')) goto LAB_0011cad2;
                                    }
                                    else if (cVar2 == '\0') {
                                      pxVar39 = (xml_node_struct *)
                                                ((long)&pxVar14[-1].first_attribute + 5);
                                      goto LAB_0011d22e;
                                    }
                                    pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                                  } while( true );
                                }
                                pxVar14 = (xml_node_struct *)((long)&pxVar39->header + 2);
                                lVar24 = lVar24 + 1;
                                goto LAB_0011ca56;
                              }
                              if (*(byte *)((long)&pxVar39->header + 3) == 0x2d) {
                                pxVar39 = (xml_node_struct *)((long)&pxVar39->header + 4);
                                do {
                                  bVar19 = (byte)pxVar39->header;
                                  if (bVar19 == 0x2d) {
                                    if ((*(byte *)((long)&pxVar39->header + 1) == 0x2d) &&
                                       (*(byte *)((long)&pxVar39->header + 2) == 0x3e))
                                    goto LAB_0011cb56;
                                  }
                                  else if (bVar19 == 0) break;
                                  pxVar39 = (xml_node_struct *)((long)&pxVar39->header + 1);
                                } while( true );
                              }
                            }
                            goto LAB_0011d22e;
                          }
                          if (bVar19 == 0x3e) {
                            if (lVar24 == 0) goto LAB_0011d057;
                            lVar24 = lVar24 + -1;
                          }
                          else if (bVar19 == 0) goto LAB_0011d043;
                          pxVar14 = (xml_node_struct *)((long)&pxVar39->header + 1);
                        }
                        goto LAB_0011ca56;
                      }
                      goto LAB_0011d22e;
                    }
LAB_0011d158:
                    xVar33 = status_unrecognized_tag;
                  }
                  else if (bVar19 == 0x2d) {
                    if (*(byte *)((long)&pxVar12->header + 2) == 0x2d) {
                      pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 3);
                      local_90 = pxVar16;
                      if ((options & 2) == 0) {
LAB_0011c76a:
                        if (local_6c != 0x22) {
                          do {
                            if (*(byte *)&pxVar14->header == 0x2d) {
                              if (*(byte *)((long)&pxVar14->header + 1) == 0x2d) {
                                bVar19 = *(byte *)((long)&pxVar14->header + 2);
                                if ((bVar19 == 0x3e) || (bVar18 == 0 && bVar19 == 0))
                                goto LAB_0011cf77;
                              }
                            }
                            else if (*(byte *)&pxVar14->header == 0) goto LAB_0011d1f1;
                            pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                          } while( true );
                        }
                        local_68.end = (char_t *)0x0;
                        local_68.size = 0;
LAB_0011c77f:
                        do {
                          while (bVar19 = *(byte *)&pxVar14->header,
                                ((anonymous_namespace)::chartype_table[bVar19] & 0x20) == 0) {
                            bVar19 = *(byte *)((long)&pxVar14->header + 1);
                            if (((anonymous_namespace)::chartype_table[bVar19] & 0x20) != 0) {
                              pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                              break;
                            }
                            bVar19 = *(byte *)((long)&pxVar14->header + 2);
                            if (((anonymous_namespace)::chartype_table[bVar19] & 0x20) != 0) {
                              pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 2);
                              break;
                            }
                            bVar19 = *(byte *)((long)&pxVar14->header + 3);
                            if (((anonymous_namespace)::chartype_table[bVar19] & 0x20) != 0) {
                              pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 3);
                              break;
                            }
                            pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 4);
                          }
                          if (bVar19 == 0xd) {
                            local_b0 = (xml_node_struct *)((long)&pxVar14->header + 1);
                            *(byte *)&pxVar14->header = 10;
                            ppcVar3 = (char_t **)&pxVar14->header;
                            pxVar14 = local_b0;
                            if (*(byte *)((long)ppcVar3 + 1) == 10) {
                              gap::push(&local_68,(char_t **)&local_b0,1);
                              pxVar14 = local_b0;
                            }
                            goto LAB_0011c77f;
                          }
                          local_b0 = pxVar14;
                          if (bVar19 == 0x2d) {
                            if ((*(byte *)((long)&pxVar14->header + 1) == 0x2d) &&
                               ((bVar19 = *(byte *)((long)&pxVar14->header + 2), bVar19 == 0x3e ||
                                (bVar18 == 0 && bVar19 == 0)))) goto LAB_0011cf93;
                          }
                          else if (bVar19 == 0) {
                            xVar33 = status_bad_comment;
                            pxVar14 = (xml_node_struct *)pxVar16->value;
                            goto LAB_0011d236;
                          }
                          pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                        } while( true );
                      }
                      pxVar16 = append_new_node(pxVar16,(xml_allocator *)local_a8,node_comment);
                      if (pxVar16 != (xml_node_struct *)0x0) {
                        pxVar16->value = (char_t *)pxVar14;
                        goto LAB_0011c76a;
                      }
LAB_0011d210:
                      xVar33 = status_out_of_memory;
                    }
                    else {
                      pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 2);
LAB_0011d1f1:
                      xVar33 = status_bad_comment;
                    }
                  }
                  else if ((bVar1 == 0x2d) && (bVar19 == 0)) {
                    xVar33 = status_bad_comment;
                  }
                  else {
                    xVar33 = (uint)(bVar1 == 0x5b && bVar19 == 0) * 3 + status_unrecognized_tag;
                  }
                }
              }
              else if (bVar19 == 0x3f) {
                bVar19 = *(byte *)((long)&pxVar12->header + 1);
                pxVar39 = (xml_node_struct *)((long)&pxVar12->header + 1);
                if ((char)(anonymous_namespace)::chartype_table[bVar19] < '\0') {
                  lVar24 = 4;
                  pbVar27 = (byte *)((long)&pxVar12->header + 3);
                  pxVar30 = (xml_node_struct *)((long)&pxVar12->header + 1);
                  lVar26 = 1;
                  do {
                    lVar31 = lVar26;
                    pxVar14 = pxVar30;
                    pbVar25 = pbVar27;
                    bVar20 = (byte)pxVar14->header;
                    uVar43 = (ulong)bVar20;
                    lVar24 = lVar24 + -1;
                    pxVar30 = (xml_node_struct *)((long)&pxVar14->header + 1);
                    pbVar27 = pbVar25 + 1;
                    lVar26 = lVar31 + 1;
                  } while (((anonymous_namespace)::chartype_table[uVar43] & 0x40) != 0);
                  pxVar40 = pxVar14;
                  if (bVar20 != 0) {
                    pxVar40 = (xml_node_struct *)((long)&pxVar12->header + lVar31);
                    if (((bVar19 & 0xdf) == 0x58) && ((pxVar12->header & 0xdf0000) == 0x4d0000)) {
                      bVar5 = (pxVar12->header & 0xdf000000) != 0x4c000000;
                      uVar29 = 1;
                      if (lVar24 == 0 && !bVar5) {
                        uVar29 = 0x100;
                      }
                      if ((options & uVar29) == 0) {
LAB_0011c84d:
                        do {
                          if ((char)uVar43 == '?') {
                            bVar19 = *(byte *)((long)&pxVar14->header + 1);
                            if ((bVar19 == 0x3e) || (bVar18 == 0 && bVar19 == 0)) goto LAB_0011cc75;
                          }
                          else {
                            if ((int)uVar43 == 0) {
                              xVar33 = status_bad_pi;
                              goto LAB_0011d236;
                            }
                            bVar19 = *(byte *)((long)&pxVar14->header + 1);
                          }
                          uVar43 = (ulong)bVar19;
                          pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                        } while( true );
                      }
                      if (lVar24 != 0 || bVar5) goto LAB_0011c922;
                      local_90 = pxVar39;
                      if (pxVar16->parent != (xml_node_struct *)0x0) goto LAB_0011d312;
                      pxVar16 = append_new_node(pxVar16,(xml_allocator *)local_a8,node_declaration);
                      if (pxVar16 == (xml_node_struct *)0x0) goto LAB_0011d1a2;
                      bVar5 = true;
                    }
                    else {
                      if ((options & 1) == 0) goto LAB_0011c84d;
LAB_0011c922:
                      local_90 = pxVar39;
                      pxVar16 = append_new_node(pxVar16,(xml_allocator *)local_a8,node_pi);
                      if (pxVar16 == (xml_node_struct *)0x0) {
LAB_0011d1a2:
                        xVar33 = status_out_of_memory;
                        pxVar14 = pxVar40;
                        goto LAB_0011d236;
                      }
                      bVar5 = false;
                    }
                    pxVar16->name = (char_t *)local_90;
                    uVar43 = (ulong)(byte)pxVar14->header;
                    *(byte *)&pxVar14->header = 0;
                    if (uVar43 != 0x3f) {
                      pxVar40 = pxVar30;
                      if (((anonymous_namespace)::chartype_table[uVar43] & 8) != 0) {
                        do {
                          pbVar27 = pbVar25;
                          uVar43 = (ulong)*(byte *)((long)&pxVar14->header + 1);
                          pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
                          pbVar25 = pbVar27 + 1;
                        } while (((anonymous_namespace)::chartype_table[uVar43] & 8) != 0);
                        do {
                          if ((char)uVar43 == '?') {
                            bVar19 = *pbVar27;
                            if ((bVar19 == 0x3e) || (bVar18 == 0 && bVar19 == 0)) goto LAB_0011cd4d;
                          }
                          else {
                            if ((int)uVar43 == 0) {
                              pxVar39 = (xml_node_struct *)(pbVar27 + -1);
                              goto LAB_0011d188;
                            }
                            bVar19 = *pbVar27;
                          }
                          uVar43 = (ulong)bVar19;
                          pbVar27 = pbVar27 + 1;
                        } while( true );
                      }
                      goto LAB_0011d312;
                    }
                    bVar19 = (byte)pxVar30->header;
                    if ((bVar19 != 0x3e) && (bVar18 != 0 || bVar19 != 0)) {
                      pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1);
                      goto LAB_0011d312;
                    }
                    pxVar16 = pxVar16->parent;
                    pxVar14 = (xml_node_struct *)((long)&pxVar30->header + (ulong)(bVar19 == 0x3e));
                    goto LAB_0011ce43;
                  }
LAB_0011d312:
                  xVar33 = status_bad_pi;
                  pxVar14 = pxVar40;
                }
                else {
LAB_0011d188:
                  xVar33 = status_bad_pi;
                  pxVar14 = pxVar39;
                }
              }
              else if (bVar19 == 0x2f) {
                pbVar27 = pxVar16->name;
                pxVar39 = (xml_node_struct *)((long)&pxVar12->header + 1);
                pxVar12 = pxVar39;
                if (pbVar27 == (byte *)0x0) {
LAB_0011d0fd:
                  xVar33 = status_end_element_mismatch;
                  pxVar14 = pxVar39;
                }
                else {
                  while (bVar19 = (byte)pxVar12->header,
                        ((anonymous_namespace)::chartype_table[bVar19] & 0x40) != 0) {
                    bVar20 = *pbVar27;
                    pbVar27 = pbVar27 + 1;
                    pxVar12 = (xml_node_struct *)((long)&pxVar12->header + 1);
                    if (bVar19 != bVar20) goto LAB_0011d0fd;
                  }
                  if (*pbVar27 == 0) goto code_r0x0011c895;
                  xVar33 = status_bad_end_element;
                  if (((bVar19 != 0) || (*pbVar27 != bVar1)) || (pxVar14 = pxVar12, pbVar27[1] != 0)
                     ) {
                    xVar33 = status_end_element_mismatch;
                    pxVar14 = pxVar39;
                  }
                }
              }
              else {
                xVar33 = (bVar1 == 0x3f && bVar19 == 0) + status_unrecognized_tag;
                pxVar14 = pxVar12;
              }
              goto LAB_0011d236;
            }
            pxVar16 = append_new_node(pxVar16,(xml_allocator *)local_a8,node_element);
            if (pxVar16 == (xml_node_struct *)0x0) goto LAB_0011d135;
            pxVar16->name = (char_t *)pxVar12;
            pxVar39 = (xml_node_struct *)((long)&pxVar12->header + 1);
            do {
              pxVar12 = pxVar39;
              uVar43 = (ulong)*(byte *)((long)&pxVar12[-1].first_attribute + 7);
              bVar19 = (anonymous_namespace)::chartype_table[uVar43];
              if ((bVar19 & 0x40) == 0) {
                pxVar12 = (xml_node_struct *)((long)&pxVar12[-1].first_attribute + 7);
                goto LAB_0011c8c8;
              }
              uVar43 = (ulong)(byte)pxVar12->header;
              bVar19 = (anonymous_namespace)::chartype_table[uVar43];
              if ((bVar19 & 0x40) == 0) goto LAB_0011c8c8;
              uVar43 = (ulong)*(byte *)((long)&pxVar12->header + 1);
              bVar19 = (anonymous_namespace)::chartype_table[uVar43];
              if ((bVar19 & 0x40) == 0) {
                pxVar12 = (xml_node_struct *)((long)&pxVar12->header + 1);
                goto LAB_0011c8c8;
              }
              uVar43 = (ulong)*(byte *)((long)&pxVar12->header + 2);
              bVar19 = (anonymous_namespace)::chartype_table[uVar43];
              pxVar39 = (xml_node_struct *)((long)&pxVar12->header + 4);
            } while ((bVar19 & 0x40) != 0);
            pxVar12 = (xml_node_struct *)((long)&pxVar12->header + 2);
LAB_0011c8c8:
            pxVar39 = (xml_node_struct *)((long)&pxVar12->header + 1);
            *(byte *)&pxVar12->header = 0;
          } while ((char)uVar43 == '>');
          pxVar14 = pxVar39;
          if ((bVar19 & 8) != 0) goto LAB_0011ce5b;
          if ((char)uVar43 == '\0') {
            pxVar39 = pxVar12;
            if (bVar1 == 0x3e) goto LAB_0011c458;
          }
          else {
            pxVar12 = pxVar39;
            if ((int)uVar43 == 0x2f) {
              bVar19 = (byte)pxVar39->header;
              if ((bVar19 != 0x3e) && (bVar18 != 0 || bVar19 != 0)) goto LAB_0011d300;
              pxVar16 = pxVar16->parent;
              pxVar39 = (xml_node_struct *)((long)&pxVar39->header + (ulong)(bVar19 == 0x3e));
              goto LAB_0011c458;
            }
          }
          goto LAB_0011d300;
        }
        __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
        __return_storage_ptr__->offset = 0;
        goto LAB_0011d2e4;
      }
    }
    else {
      lVar26 = -1;
      lVar31 = 0;
      puVar34 = (ushort *)contents;
      for (uVar32 = uVar43; uVar32 != 0; uVar32 = uVar32 + lVar37) {
        uVar35 = swap_bytes(*puVar34);
        lVar37 = lVar26;
        if (uVar35 < 0xd800) {
          lVar36 = 3 - (ulong)(uVar35 < 0x800);
          if (uVar35 < 0x80) {
            lVar36 = lVar24;
          }
          lVar31 = lVar31 + lVar36;
LAB_0011bf6d:
          puVar21 = puVar34 + 1;
        }
        else {
          if ((~uVar35 & 0xe000) == 0) {
            lVar31 = lVar31 + 3;
            goto LAB_0011bf6d;
          }
          puVar21 = puVar34 + 1;
          if (((uVar32 != 1) && ((uVar35 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc) == 0xdc)) {
            lVar31 = lVar31 + 4;
            puVar21 = puVar34 + 2;
            lVar37 = -2;
          }
        }
        puVar34 = puVar21;
      }
      puVar9 = (value_type)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(lVar31 + 1U);
      if (puVar9 != (value_type)0x0) {
        lVar24 = -1;
        puVar10 = puVar9;
        puVar41 = (undefined2 *)contents;
        for (; uVar43 != 0; uVar43 = uVar43 + lStack_e0) {
          uVar35 = swap_bytes(*puVar41);
          uVar29 = (uint)uVar35;
          lStack_e0 = lVar24;
          if ((uVar35 < 0xd800) || ((~uVar29 & 0xe000) == 0)) {
            puVar10 = utf8_writer::low(puVar10,uVar29);
            puVar22 = puVar41 + 1;
          }
          else {
            puVar22 = puVar41 + 1;
            if ((uVar43 != 1) && ((uVar29 & 0xfc00) == 0xd800)) {
              uVar28 = swap_bytes(*puVar22);
              if ((uVar28 & 0xfc00) == 0xdc00) {
                puVar10 = utf8_writer::high(puVar10,(uVar35 & 0x3ff) * 0x400 + 0x10000 +
                                                    (uVar28 & 0x3ff));
                puVar22 = puVar41 + 2;
                lStack_e0 = -2;
              }
            }
          }
          puVar41 = puVar22;
        }
        if (puVar10 != puVar9 + lVar31) {
          pcVar23 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0011d3eb;
        }
        *puVar10 = '\0';
        length = lVar31 + 1U;
        buffer = puVar9;
        goto LAB_0011c2d7;
      }
    }
  }
  else {
    if (1 < xVar6 - encoding_utf32_le) {
      if (xVar6 != encoding_latin1) {
        __assert_fail("false && \"Invalid encoding\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x8e3,
                      "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                     );
      }
      lVar24 = 0;
      pcVar23 = (char *)contents;
LAB_0011c086:
      if (size + lVar24 != 0) {
        if (-1 < *pcVar23) goto code_r0x0011c09b;
        lVar26 = 0;
        sVar38 = -lVar24;
        for (sVar11 = sVar38; size != sVar11; sVar11 = sVar11 + 1) {
          lVar26 = (lVar26 - (ulong)(-1 < *(char *)((long)contents + sVar11))) + 2;
        }
        sVar42 = (lVar26 - lVar24) + 1;
        pcVar8 = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(sVar42);
        if (pcVar8 != (char_t *)0x0) {
          memcpy(pcVar8,contents,sVar38);
          puVar9 = pcVar8 + -lVar24;
          for (; size != sVar38; sVar38 = sVar38 + 1) {
            puVar9 = utf8_writer::low(puVar9,(uint)*(byte *)((long)contents + sVar38));
          }
          if (pcVar8 + (lVar26 - lVar24) != puVar9) {
            __assert_fail("oend == obegin + length",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x8bc,
                          "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                         );
          }
          *puVar9 = '\0';
          length = sVar42;
          buffer = pcVar8;
          goto LAB_0011c2d7;
        }
        goto LAB_0011bdcd;
      }
      goto LAB_0011bdbd;
    }
    uVar43 = size >> 2;
    if (xVar6 == encoding_utf32_le) {
      vVar7 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
              process<pugi::impl::(anonymous_namespace)::utf8_counter>(contents,uVar43);
      pcVar8 = (char_t *)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(vVar7 + 1);
      if (pcVar8 != (char_t *)0x0) {
        puVar9 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
                 process<pugi::impl::(anonymous_namespace)::utf8_writer>(contents,uVar43,pcVar8);
        if (puVar9 != pcVar8 + vVar7) {
          pcVar23 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
          goto LAB_0011d3eb;
        }
        *puVar9 = '\0';
        length = vVar7 + 1;
        buffer = pcVar8;
        goto LAB_0011c2d7;
      }
    }
    else {
      lVar26 = 0;
      for (uVar32 = 0; uVar43 != uVar32; uVar32 = uVar32 + 1) {
        uVar29 = swap_bytes(*(undefined4 *)((long)contents + uVar32 * 4));
        if (uVar29 < 0x10000) {
          lVar31 = 3 - (ulong)(uVar29 < 0x800);
          if (uVar29 < 0x80) {
            lVar31 = lVar24;
          }
          lVar26 = lVar26 + lVar31;
        }
        else {
          lVar26 = lVar26 + 4;
        }
      }
      sVar38 = lVar26 + 1;
      puVar9 = (value_type)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(sVar38);
      if (puVar9 != (value_type)0x0) {
        puVar10 = puVar9;
        for (uVar32 = 0; uVar43 != uVar32; uVar32 = uVar32 + 1) {
          uVar29 = swap_bytes(*(undefined4 *)((long)contents + uVar32 * 4));
          if (uVar29 < 0x10000) {
            puVar10 = utf8_writer::low(puVar10,uVar29);
          }
          else {
            puVar10 = utf8_writer::high(puVar10,uVar29);
          }
        }
        if (puVar10 != puVar9 + lVar26) {
          pcVar23 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0011d3eb;
        }
        goto LAB_0011c2ca;
      }
    }
  }
LAB_0011bdcd:
  __return_storage_ptr__->encoding = encoding_auto;
  __return_storage_ptr__->status = status_out_of_memory;
LAB_0011bddc:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
code_r0x0011c09b:
  lVar24 = lVar24 + -1;
  pcVar23 = pcVar23 + 1;
  goto LAB_0011c086;
LAB_0011d00a:
  pcVar15 = gap::flush(&local_68,(char_t *)pxVar14);
  *pcVar15 = '\0';
  goto LAB_0011d02b;
LAB_0011cffd:
  *(byte *)&pxVar14->header = 0;
LAB_0011d02b:
  pxVar39 = (xml_node_struct *)
            ((long)&pxVar14->header + (ulong)(*(byte *)((long)&pxVar14->header + 2) == 0x3e) + 2);
  goto LAB_0011c458;
LAB_0011d043:
  if ((bVar1 != 0x3e) || (lVar24 != 0)) {
LAB_0011d22e:
    xVar33 = status_bad_doctype;
    pxVar14 = pxVar39;
    goto LAB_0011d236;
  }
LAB_0011d057:
  if ((bVar19 != 0x3e) && (bVar18 != 0 || bVar19 != 0)) {
    __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0xc39,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if (bVar19 != 0) {
    *(byte *)&pxVar39->header = 0;
    pxVar39 = (xml_node_struct *)((long)&pxVar39->header + 1);
  }
  if ((options >> 9 & 1) != 0) {
    pbVar27 = (byte *)((long)&pxVar12->header + 7);
    do {
      pbVar25 = pbVar27 + 1;
      pbVar27 = pbVar27 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar25] & 8) != 0);
    pxVar14 = append_new_node(pxVar16,(xml_allocator *)local_a8,node_doctype);
    pxVar12 = pxVar39;
    if (pxVar14 == (xml_node_struct *)0x0) {
LAB_0011d135:
      xVar33 = status_out_of_memory;
      pxVar14 = pxVar12;
      goto LAB_0011d236;
    }
    pxVar14->value = pbVar27;
  }
  goto LAB_0011c458;
LAB_0011cb09:
  pxVar14 = (xml_node_struct *)((long)&pxVar39->header + 2);
  goto LAB_0011ca56;
LAB_0011cb56:
  pxVar14 = (xml_node_struct *)((long)&pxVar39->header + 3);
LAB_0011ca56:
  bVar19 = (byte)pxVar14->header;
  pxVar39 = pxVar14;
  goto LAB_0011ca0c;
LAB_0011cad2:
  if (lVar26 != 0) {
    lVar26 = lVar26 + -1;
    goto LAB_0011ca8e;
  }
  goto LAB_0011ca56;
LAB_0011cf77:
  if ((options & 2) != 0) {
    *(byte *)&pxVar14->header = 0;
  }
  pxVar39 = (xml_node_struct *)((long)&pxVar14->header + (ulong)(bVar19 == 0x3e) + 2);
  pxVar16 = local_90;
  goto LAB_0011c458;
LAB_0011cf93:
  pcVar15 = gap::flush(&local_68,(char_t *)pxVar14);
  *pcVar15 = '\0';
  pxVar39 = (xml_node_struct *)
            ((long)&pxVar14->header + (ulong)(*(byte *)((long)&pxVar14->header + 2) == 0x3e) + 2);
  pxVar16 = local_90;
  goto LAB_0011c458;
LAB_0011cc75:
  pxVar14 = (xml_node_struct *)((long)&pxVar14->header + (ulong)(bVar19 == 0x3e) + 1);
LAB_0011ce43:
  if (pxVar16 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0xd4f,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  goto LAB_0011ce4c;
LAB_0011cd4d:
  if (!bVar5) {
    pxVar16->value = (char_t *)pxVar14;
    pxVar16 = pxVar16->parent;
    pbVar27[-1] = 0;
    pxVar14 = (xml_node_struct *)(pbVar27 + (*pbVar27 == 0x3e));
    goto LAB_0011ce43;
  }
  pbVar27[-1] = 0x2f;
LAB_0011ce4c:
  pxVar39 = pxVar14;
  if ((pxVar16->header & 0xf) != 7) goto LAB_0011c458;
LAB_0011ce5b:
  while( true ) {
    do {
      pxVar12 = pxVar14;
      bVar19 = (byte)pxVar12->header;
      pxVar14 = (xml_node_struct *)((long)&pxVar12->header + 1);
    } while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar19]) break;
    pxVar13 = append_new_attribute(pxVar16,(xml_allocator *)local_a8);
    if (pxVar13 == (xml_attribute_struct *)0x0) {
      xVar33 = status_out_of_memory;
      pxVar14 = pxVar12;
      goto LAB_0011d236;
    }
    pxVar13->name = (char_t *)pxVar12;
    pxVar39 = (xml_node_struct *)((long)&pxVar12->header + 1);
    do {
      pxVar14 = pxVar39;
      bVar19 = *(byte *)((long)&pxVar14[-1].first_attribute + 7);
      bVar20 = (anonymous_namespace)::chartype_table[bVar19];
      if ((bVar20 & 0x40) == 0) {
        pxVar14 = (xml_node_struct *)((long)&pxVar14[-1].first_attribute + 7);
        goto LAB_0011cedc;
      }
      bVar19 = (byte)pxVar14->header;
      bVar20 = (anonymous_namespace)::chartype_table[bVar19];
      if ((bVar20 & 0x40) == 0) goto LAB_0011cedc;
      bVar19 = *(byte *)((long)&pxVar14->header + 1);
      bVar20 = (anonymous_namespace)::chartype_table[bVar19];
      if ((bVar20 & 0x40) == 0) {
        pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1);
        goto LAB_0011cedc;
      }
      bVar19 = *(byte *)((long)&pxVar14->header + 2);
      bVar20 = (anonymous_namespace)::chartype_table[bVar19];
      pxVar39 = (xml_node_struct *)((long)&pxVar14->header + 4);
    } while ((bVar20 & 0x40) != 0);
    pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 2);
LAB_0011cedc:
    *(byte *)&pxVar14->header = 0;
    while (pxVar14 = (xml_node_struct *)((long)&pxVar14->header + 1), (bVar20 & 8) != 0) {
      bVar19 = (byte)pxVar14->header;
      bVar20 = (anonymous_namespace)::chartype_table[bVar19];
    }
    pxVar39 = pxVar14;
    if (bVar19 != 0x3d) {
LAB_0011d142:
      xVar33 = status_bad_attribute;
      goto LAB_0011d236;
    }
    do {
      pxVar14 = pxVar39;
      bVar19 = (byte)pxVar14->header;
      pxVar39 = (xml_node_struct *)((long)&pxVar14->header + 1);
    } while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0);
    if ((bVar19 != 0x22) && (bVar19 != 0x27)) goto LAB_0011d142;
    pxVar13->value = (char_t *)pxVar39;
    pxVar14 = (xml_node_struct *)(*local_40)(pxVar39);
    if (pxVar14 == (xml_node_struct *)0x0) {
      pxVar14 = (xml_node_struct *)pxVar13->value;
      goto LAB_0011d142;
    }
    if ((char)(anonymous_namespace)::chartype_table[(byte)pxVar14->header] < '\0') {
      xVar33 = status_bad_attribute;
      goto LAB_0011d236;
    }
  }
  pxVar39 = pxVar14;
  if (bVar19 == 0x3e) goto LAB_0011c458;
  if (bVar19 == 0x2f) {
    bVar19 = (byte)pxVar14->header;
    if (bVar19 == 0x3e) {
      pxVar39 = (xml_node_struct *)((long)&pxVar12->header + 2);
      pxVar16 = pxVar16->parent;
      goto LAB_0011c458;
    }
    pxVar12 = pxVar14;
    if ((bVar1 == 0x3e) && (bVar19 == 0)) {
      pxVar16 = pxVar16->parent;
      goto LAB_0011c458;
    }
  }
  else if ((bVar1 == 0x3e) && (pxVar39 = pxVar12, bVar19 == 0)) goto LAB_0011c458;
LAB_0011d300:
  xVar33 = status_bad_start_element;
  pxVar14 = pxVar12;
  goto LAB_0011d236;
code_r0x0011c895:
  do {
    pxVar14 = pxVar12;
    bVar19 = (byte)pxVar14->header;
    pxVar12 = (xml_node_struct *)((long)&pxVar14->header + 1);
  } while (((anonymous_namespace)::chartype_table[bVar19] & 8) != 0);
  pxVar39 = pxVar14;
  bVar20 = bVar1;
  if (bVar19 != 0) {
    pxVar39 = pxVar12;
    bVar20 = bVar19;
  }
  pxVar16 = pxVar16->parent;
  if (bVar20 != 0x3e) goto LAB_0011d327;
  goto LAB_0011c458;
LAB_0011d327:
  xVar33 = status_bad_end_element;
LAB_0011d236:
  pxVar16 = (xml_node_struct *)((long)pxVar14 - (long)pcVar8);
  if (pxVar14 != (xml_node_struct *)0x0) {
    pxVar14 = pxVar16;
  }
  if (((long)pxVar14 < 0) || (local_38 < pxVar14)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0xdc8,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (xVar33 == status_ok) {
    if (bVar1 != 0x3c) {
      pxVar39 = pxVar14;
      if ((options >> 0xc & 1) == 0) {
        ppxVar17 = &local_58->next_sibling;
        if (local_58 == (xml_node_struct *)0x0) {
          ppxVar17 = local_50;
        }
        do {
          pxVar16 = *ppxVar17;
          if (pxVar16 == (xml_node_struct *)0x0) {
            __return_storage_ptr__->status = status_no_document_element;
            goto LAB_0011d2d6;
          }
          ppxVar17 = &pxVar16->next_sibling;
        } while ((pxVar16->header & 0xf) != 2);
      }
      goto LAB_0011d2c8;
    }
    __return_storage_ptr__->status = status_unrecognized_tag;
LAB_0011d2d6:
    __return_storage_ptr__->offset = (ptrdiff_t)local_80;
  }
  else {
    if (pxVar14 == (xml_node_struct *)0x0) {
      pxVar39 = (xml_node_struct *)0x0;
    }
    else {
      pxVar39 = (xml_node_struct *)((long)&pxVar14[-1].first_attribute + 7);
      if (bVar1 != 0) {
        pxVar39 = pxVar16;
      }
      if (pxVar14 != local_80) {
        pxVar39 = pxVar16;
      }
    }
LAB_0011d2c8:
    __return_storage_ptr__->status = xVar33;
    __return_storage_ptr__->offset = (ptrdiff_t)pxVar39;
  }
  xVar6 = (xml_encoding)local_88;
LAB_0011d2e4:
  __return_storage_ptr__->encoding = xVar6;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}